

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O2

void duckdb_je_psset_update_end(psset_t *psset,hpdata_t *ps)

{
  ps->h_updating = false;
  psset_stats_insert(psset,ps);
  if (ps->h_alloc_allowed == true) {
    psset_alloc_container_insert(psset,ps);
  }
  psset_maybe_insert_purge_list(psset,ps);
  if (ps->h_hugify_allowed == true) {
    if (ps->h_in_psset_hugify_container == false) {
      ps->h_in_psset_hugify_container = true;
      hpdata_hugify_list_append(&psset->to_hugify,ps);
      return;
    }
  }
  else if (ps->h_in_psset_hugify_container != false) {
    ps->h_in_psset_hugify_container = false;
    hpdata_hugify_list_remove(&psset->to_hugify,ps);
    return;
  }
  return;
}

Assistant:

void
psset_update_end(psset_t *psset, hpdata_t *ps) {
	assert(hpdata_in_psset_get(ps));
	hpdata_updating_set(ps, false);
	psset_stats_insert(psset, ps);

	/*
	 * The update begin should have removed ps from whatever alloc container
	 * it was in.
	 */
	assert(!hpdata_in_psset_alloc_container_get(ps));
	if (hpdata_alloc_allowed_get(ps)) {
		psset_alloc_container_insert(psset, ps);
	}
	psset_maybe_insert_purge_list(psset, ps);

	if (hpdata_hugify_allowed_get(ps)
	    && !hpdata_in_psset_hugify_container_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, true);
		hpdata_hugify_list_append(&psset->to_hugify, ps);
	} else if (!hpdata_hugify_allowed_get(ps)
	    && hpdata_in_psset_hugify_container_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, false);
		hpdata_hugify_list_remove(&psset->to_hugify, ps);
	}
	hpdata_assert_consistent(ps);
}